

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O2

void __thiscall
mod_verify::ModVerifyTest2<unsigned_int>::ModVerifyTest2(ModVerifyTest2<unsigned_int> *this)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  uint r;
  
  x.m_int = 0x80000000;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%(&x,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0xffffffff);
  r = x.m_int;
  operator%=(&r,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0xffffffff);
  return;
}

Assistant:

ModVerifyTest2<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;

		// GCC using a native built-in int will raise SIGFPE or
		// #DE. However, according to LeBlanc, SafeInt's contract
		// is to return the correct mathematical result or throw.
		// const bool expected = (s == Signed ? true : false);
		const bool expected = false;

		bool overflow;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m((T)-1);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}
	}